

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

void __thiscall
flatbuffers::java::JavaGenerator::GenStructPackCall_ObjectAPI
          (JavaGenerator *this,StructDef *struct_def,string *code,string *prefix)

{
  IdlNamer *pIVar1;
  FieldDef *pFVar2;
  StructDef *struct_def_00;
  pointer ppFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar1 = &this->namer_;
  for (ppFVar3 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar3 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    pFVar2 = *ppFVar3;
    struct_def_00 = (pFVar2->value).type.struct_def;
    if (struct_def_00 == (StructDef *)0x0) {
      std::__cxx11::string::append((char *)code);
      (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_90,pIVar1,pFVar2);
      std::operator+(&local_70,prefix,&local_90);
      std::__cxx11::string::append((string *)code);
    }
    else {
      (*(pIVar1->super_Namer)._vptr_Namer[0x12])(&local_90,pIVar1,pFVar2);
      std::operator+(&local_70,prefix,&local_90);
      std::operator+(&local_50,&local_70,"_");
      GenStructPackCall_ObjectAPI(this,struct_def_00,code,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void GenStructPackCall_ObjectAPI(const StructDef &struct_def,
                                   std::string &code,
                                   std::string prefix) const {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field_type.struct_def != nullptr) {
        GenStructPackCall_ObjectAPI(*field_type.struct_def, code,
                                    prefix + namer_.Field(field) + "_");
      } else {
        code += ",\n";
        code += prefix + namer_.Field(field);
      }
    }
  }